

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

int count_dups<int>(vector<int,_std::allocator<int>_> *t)

{
  ulong uVar1;
  int iVar2;
  pointer piVar3;
  long lVar4;
  ulong uVar5;
  undefined1 *puVar6;
  pointer piVar7;
  undefined1 *__s;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  undefined8 uStack_30;
  
  piVar3 = (t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar5 = (long)(t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish - (long)piVar3;
  lVar10 = (long)uVar5 >> 2;
  lVar4 = -(lVar10 + 0xfU & 0xfffffffffffffff0);
  __s = &stack0xffffffffffffffd8 + lVar4;
  iVar12 = 0;
  *(undefined8 *)((long)&uStack_30 + lVar4) = 0x10c5bb;
  memset(__s,0,(long)(int)(uVar5 >> 2));
  uVar9 = (uint)lVar10;
  if (0 < (int)uVar9) {
    uVar11 = (ulong)(uVar9 & 0x7fffffff);
    iVar12 = 0;
    uVar8 = 0;
    puVar6 = __s;
    piVar7 = piVar3;
    uVar5 = uVar11;
    do {
      uVar5 = uVar5 - 1;
      piVar7 = piVar7 + 1;
      puVar6 = puVar6 + 1;
      uVar1 = uVar8 + 1;
      if (uVar1 < uVar11 && __s[uVar8] == '\0') {
        iVar2 = piVar3[uVar8];
        uVar8 = 0;
        do {
          if (iVar2 == piVar7[uVar8]) {
            iVar12 = iVar12 + 1;
            puVar6[uVar8] = 1;
          }
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
      uVar8 = uVar1;
    } while (uVar1 != uVar11);
  }
  return iVar12;
}

Assistant:

int count_dups(std::vector<T> &t)
{
    int dups = 0;
    int N = t.size();
    STACKALLOC(bool, mark, t.size());
    memset(mark, 0, N);
    for(int i=0; i<N; ++i) {
        if(mark[i])
            continue;
        for(int j=i+1; j<N; ++j) {
            if(t[i] == t[j]) {
                dups++;
                mark[j] = true;
            }
        }
    }
    return dups;
}